

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O2

ProgramBinary * vk::assembleProgram(SpirVAsmSource *program,SpirVProgramInfo *buildInfo)

{
  bool bVar1;
  ProgramBinary *pPVar2;
  InternalError *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = assembleSpirV(program,&binary,buildInfo);
  if (bVar1) {
    pPVar2 = anon_unknown_8::createProgramBinaryFromSpirV(&binary);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&binary.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return pPVar2;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (this,"Failed to assemble SPIR-V",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkPrograms.cpp"
             ,0x95);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ProgramBinary* assembleProgram (const SpirVAsmSource& program, SpirVProgramInfo* buildInfo)
{
	const bool			validateBinary		= VALIDATE_BINARIES;
	vector<deUint32>	binary;

	if (!assembleSpirV(&program, &binary, buildInfo))
		TCU_THROW(InternalError, "Failed to assemble SPIR-V");

	if (validateBinary)
	{
		std::ostringstream	validationLog;

		if (!validateSpirV(binary.size(), &binary[0], &validationLog))
		{
			buildInfo->compileOk	 = false;
			buildInfo->infoLog		+= "\n" + validationLog.str();

			TCU_THROW(InternalError, "Validation failed for assembled SPIR-V binary");
		}
	}

	return createProgramBinaryFromSpirV(binary);
}